

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AStateProvider_A_FireProjectile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  DObject *this;
  void *pvVar2;
  AWeapon *this_00;
  bool bVar3;
  AActor *this_01;
  AActor *source;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  PClassActor *type;
  double dVar7;
  double z;
  void *pvVar8;
  DVector2 ofs;
  DAngle local_60;
  DAngle ang;
  FTranslatedLineTarget t;
  
  if (numparam < 1) {
LAB_003de168:
    pcVar4 = "(paramnum) < numparam";
LAB_003de181:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7c9,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003de15f:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003de181;
  }
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_003dddd2;
    bVar3 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003de181;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_003de15f;
LAB_003dddd2:
    source = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_003de168;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003de15f;
  this = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if ((this != (DObject *)0x0) &&
       (bVar3 = DObject::IsKindOf(this,AStateProvider::RegistrationInfo.MyClass), !bVar3)) {
      pcVar4 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
      goto LAB_003de181;
    }
  }
  else if (this != (DObject *)0x0) goto LAB_003de15f;
  if ((uint)numparam < 3) goto LAB_003de168;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar4 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003de181;
  }
  if (numparam == 3) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003de1a0;
  }
  if (param[3].field_0.field_3.Type != '\x03') {
LAB_003de171:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003de1a0:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x7ca,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pvVar2 = param[2].field_0.field_1.a;
  type = (PClassActor *)param[3].field_0.field_1.a;
  if (param[3].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003dde90;
    bVar3 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    bVar5 = 1;
    if (!bVar3) {
      pcVar4 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003de1a0;
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003de171;
LAB_003dde90:
    bVar5 = 0;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003de24d;
    }
    pvVar8 = param[4].field_0.field_1.a;
LAB_003dded0:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003de26c:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7cc,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar3 = param[5].field_0.i == 0;
LAB_003ddee3:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003de21c:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7cd,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar7 = param[6].field_0.f;
LAB_003ddef4:
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003de1fd:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7ce,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    z = param[7].field_0.f;
LAB_003ddf05:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003de1de:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,1999,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar6 = param[8].field_0.i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003de24d:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x7cb,
                    "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar8 = (void *)param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003dded0;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003de26c;
    }
    bVar3 = param[5].field_0.i == 0;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ddee3;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003de21c;
    }
    dVar7 = param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003ddef4;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003de1fd;
    }
    z = param[7].field_0.f;
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003ddf05;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003de1de;
    }
    uVar6 = param[8].field_0.i;
    if (numparam != 9) {
      if (param[9].field_0.field_3.Type != '\x01') {
        pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003de1bf;
      }
      goto LAB_003ddf28;
    }
    param = defaultparam->Array;
  }
  if (param[9].field_0.field_3.Type != '\x01') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003de1bf:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,2000,
                  "int AF_AStateProvider_A_FireProjectile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ddf28:
  if (source->player != (player_t *)0x0) {
    dVar1 = param[9].field_0.f;
    if (((!(bool)(bVar3 | pvVar2 == (void *)0x0)) && (*(int *)((long)pvVar2 + 8) == 1)) &&
       (this_00 = source->player->ReadyWeapon, this_00 != (AWeapon *)0x0)) {
      bVar3 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1);
      bVar5 = bVar5 & bVar3;
    }
    if (bVar5 != 0) {
      ang.Degrees = (source->Angles).Yaw.Degrees + -90.0;
      TAngle<double>::ToVector((TAngle<double> *)&ofs,dVar7);
      dVar7 = (source->Angles).Pitch.Degrees;
      local_60.Degrees = (source->Angles).Yaw.Degrees;
      if ((uVar6 & 1) != 0) {
        local_60.Degrees = local_60.Degrees + (double)pvVar8;
      }
      (source->Angles).Pitch.Degrees = dVar7 - dVar1;
      this_01 = P_SpawnPlayerMissile
                          (source,ofs.X,ofs.Y,z,type,&local_60,&t,(AActor **)0x0,false,
                           SUB41((uVar6 & 4) >> 2,0),0);
      (source->Angles).Pitch.Degrees = dVar7;
      if (this_01 != (AActor *)0x0) {
        if ((uVar6 & 2) != 0) {
          this_01->Translation = source->Translation;
        }
        if (((t.linetarget != (AActor *)0x0) && (t.unlinked == false)) &&
           (((this_01->flags2).Value & 0x40000000) != 0)) {
          (this_01->tracer).field_0.p = t.linetarget;
        }
        if ((uVar6 & 1) == 0) {
          (this_01->Angles).Yaw.Degrees = (double)pvVar8 + (this_01->Angles).Yaw.Degrees;
          dVar7 = AActor::VelXYToSpeed(this_01);
          AActor::VelFromAngle(this_01,dVar7);
        }
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireProjectile)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_CLASS		(ti, AActor);
	PARAM_ANGLE_DEF	(angle);
	PARAM_BOOL_DEF	(useammo);
	PARAM_FLOAT_DEF	(spawnofs_xy);
	PARAM_FLOAT_DEF	(spawnheight);
	PARAM_INT_DEF	(flags);
	PARAM_ANGLE_DEF	(pitch);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;
	FTranslatedLineTarget t;

		// Only use ammo if called from a weapon
	if (useammo && ACTION_CALL_FROM_PSPRITE() && weapon)
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (ti) 
	{
		DAngle ang = self->Angles.Yaw - 90;
		DVector2 ofs = ang.ToVector(spawnofs_xy);
		DAngle shootangle = self->Angles.Yaw;

		if (flags & FPF_AIMATANGLE) shootangle += angle;

		// Temporarily adjusts the pitch
		DAngle saved_player_pitch = self->Angles.Pitch;
		self->Angles.Pitch -= pitch;
		AActor * misl=P_SpawnPlayerMissile (self, ofs.X, ofs.Y, spawnheight, ti, shootangle, &t, NULL, false, (flags & FPF_NOAUTOAIM) != 0);
		self->Angles.Pitch = saved_player_pitch;

		// automatic handling of seeker missiles
		if (misl)
		{
			if (flags & FPF_TRANSFERTRANSLATION)
				misl->Translation = self->Translation;
			if (t.linetarget && !t.unlinked && (misl->flags2 & MF2_SEEKERMISSILE))
				misl->tracer = t.linetarget;
			if (!(flags & FPF_AIMATANGLE))
			{
				// This original implementation is to aim straight ahead and then offset
				// the angle from the resulting direction. 
				misl->Angles.Yaw += angle;
				misl->VelFromAngle(misl->VelXYToSpeed());
			}
		}
	}
	return 0;
}